

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void __thiscall
CodeGenGenericContext::OverwriteRegisterWithUnknown(CodeGenGenericContext *this,x86Reg reg)

{
  if (this->genRegRead[reg] == false) {
    if (this->x86Base[this->genRegUpdate[reg]].name != o_none) {
      this->x86Base[this->genRegUpdate[reg]].name = o_none;
      this->optimizationCount = this->optimizationCount + 1;
    }
  }
  this->genReg[reg].type = argNone;
  InvalidateDependand(this,reg);
  this->genReg[reg].type = argNone;
  this->genRegUpdate[reg] =
       (int)((ulong)((long)this->x86Op - (long)this->x86Base) >> 4) * -0x33333333;
  this->genRegRead[reg] = false;
  return;
}

Assistant:

void CodeGenGenericContext::OverwriteRegisterWithUnknown(x86Reg reg)
{
	// Destination is updated
	KillRegister(reg);
	InvalidateDependand(reg);

	genReg[reg].type = x86Argument::argNone;
	genRegUpdate[reg] = unsigned(x86Op - x86Base);
	genRegRead[reg] = false;
}